

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNativeOperators.cpp
# Opt level: O3

bool Js::JavascriptNativeOperators::CheckIfPolyTypeIsEquivalent
               (Type *type,JitPolyEquivalentTypeGuard *guard,uint8 index)

{
  bool bVar1;
  ThreadContext *pTVar2;
  bool bVar3;
  ScriptContext *pSVar4;
  intptr_t guardValue;
  
  pSVar4 = Js::Type::GetScriptContext(type);
  pTVar2 = pSVar4->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  guardValue = JitPolyEquivalentTypeGuard::GetPolyValue(guard,index);
  bVar3 = EquivalenceCheckHelper(type,&guard->super_JitEquivalentTypeGuard,guardValue);
  if (bVar3) {
    JitPolyEquivalentTypeGuard::SetPolyValue(guard,(intptr_t)type,index);
  }
  pTVar2->noJsReentrancy = bVar1;
  return bVar3;
}

Assistant:

bool JavascriptNativeOperators::CheckIfPolyTypeIsEquivalent(Type* type, JitPolyEquivalentTypeGuard* guard, uint8 index)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(CheckIfPolyTypeIsEquivalent, reentrancylock, type->GetScriptContext()->GetThreadContext());
        bool result = EquivalenceCheckHelper(type, guard, guard->GetPolyValue(index));
        if (result)
        {
            guard->SetPolyValue((intptr_t)type, index);
        }
        return result;
        JIT_HELPER_END(CheckIfPolyTypeIsEquivalent);
    }